

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  int iVar1;
  TidyTagId TVar2;
  Lexer *pLVar3;
  TidyParserMemory *pTVar4;
  Bool BVar5;
  long lVar6;
  Node *node;
  TidyDocImpl *pTVar7;
  Dict *pDVar8;
  Node **ppNVar9;
  uint uVar10;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *pNVar11;
  int iVar12;
  TidyParserMemory memory;
  undefined8 uStack_50;
  
  pLVar3 = doc->lexer;
  if (rowgroup == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar6 = (long)iVar1;
    if (lVar6 < 0) {
      rowgroup = (Node *)0x0;
      iVar12 = 0;
    }
    else {
      pTVar4 = (doc->stack).content;
      rowgroup = pTVar4[lVar6].original_node;
      iVar12 = pTVar4[lVar6].reentry_state;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else {
    iVar12 = 0;
    if ((rowgroup->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  do {
    while( true ) {
      do {
        while( true ) {
          while (iVar12 != 0) {
            if (iVar12 != 1) {
              if (iVar12 == 2) {
                return (Node *)0x0;
              }
              do {
              } while( true );
            }
            pLVar3->exiled = no;
            iVar12 = 0;
          }
          node = prvTidyGetToken(doc,IgnoreWhitespace);
          if (node != (Node *)0x0) break;
          iVar12 = 2;
        }
        pDVar8 = node->tag;
        if (pDVar8 == (((TidyDocImpl *)rowgroup)->root).tag) {
          if (node->type == EndTag) {
            (((TidyDocImpl *)rowgroup)->root).closed = yes;
            prvTidyFreeNode(doc,node);
            return (Node *)0x0;
          }
          goto LAB_0013f1a0;
        }
        if (((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_TABLE)) && (node->type == EndTag))
        goto LAB_0013f1a0;
        BVar5 = InsertMisc(rowgroup,node);
        iVar12 = 0;
      } while (BVar5 != no);
      if (node->tag != (Dict *)0x0) break;
      if (node->type != TextNode) goto LAB_0013f11b;
LAB_0013f06d:
      BVar5 = prvTidynodeIsText(node);
      pNVar11 = extraout_RDX;
      if ((BVar5 == no) &&
         (BVar5 = prvTidynodeHasCM(node,0x18), pNVar11 = extraout_RDX_00, BVar5 == no)) {
        if ((node->tag->model & 4) == 0) goto LAB_0013f009;
        iVar12 = 0;
        prvTidyReport(doc,rowgroup,node,0x27e);
        MoveToHead(doc,rowgroup,node);
      }
      else {
        MoveBeforeTable((TidyDocImpl *)rowgroup,node,pNVar11);
        prvTidyReport(doc,rowgroup,node,0x27e);
        pLVar3->exiled = yes;
        iVar12 = 1;
        if (node->type != TextNode) {
          uStack_50 = 0x100000000;
LAB_0013f260:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3248(CONCAT824(uStack_50,
                                                   CONCAT816(node,CONCAT88(rowgroup,
                                                  prvTidyParseRowGroup)))));
          return node;
        }
      }
    }
    if (node->type != EndTag) {
      TVar2 = node->tag->id;
      if ((TVar2 != TidyTag_TH) && (TVar2 != TidyTag_TD)) goto LAB_0013f06d;
      prvTidyUngetToken(doc);
      node = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,rowgroup,node,0x261);
    }
LAB_0013f009:
    pDVar8 = node->tag;
    if (node->type == EndTag) {
      if ((pDVar8 == (Dict *)0x0) || (pDVar8->id != TidyTag_FORM)) {
        BVar5 = prvTidynodeHasCM(node,0x18);
        pDVar8 = node->tag;
        if (BVar5 == no) {
          pTVar7 = (TidyDocImpl *)rowgroup;
          if (((pDVar8 == (Dict *)0x0) || (uVar10 = pDVar8->id - TidyTag_TD, 6 < uVar10)) ||
             ((0x49U >> (uVar10 & 0x1f) & 1) == 0)) {
            while (pTVar7 = (TidyDocImpl *)(pTVar7->root).parent, pTVar7 != (TidyDocImpl *)0x0) {
              if (pDVar8 == (pTVar7->root).tag) goto LAB_0013f1a0;
            }
            goto LAB_0013f0fe;
          }
        }
        else if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_FORM)) goto LAB_0013f04d;
      }
      else {
LAB_0013f04d:
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
    }
    else {
LAB_0013f0fe:
      if ((pDVar8->model & 0x100) == 0) {
        if (node->type != EndTag) {
          if (pDVar8->id != TidyTag_TR) {
            node = prvTidyInferredTag(doc,TidyTag_TR);
            prvTidyReport(doc,rowgroup,node,0x261);
            prvTidyUngetToken(doc);
          }
          node->parent = rowgroup;
          if ((TidyDocImpl *)rowgroup == (TidyDocImpl *)0x0) {
            node->prev = (Node *)0x0;
          }
          else {
            pNVar11 = (((TidyDocImpl *)rowgroup)->root).last;
            node->prev = pNVar11;
            ppNVar9 = &pNVar11->next;
            if (pNVar11 == (Node *)0x0) {
              ppNVar9 = &(((TidyDocImpl *)rowgroup)->root).content;
            }
            *ppNVar9 = node;
            (((TidyDocImpl *)rowgroup)->root).last = node;
          }
          uStack_50 = 0;
          goto LAB_0013f260;
        }
      }
      else if (node->type != EndTag) {
LAB_0013f1a0:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
    }
LAB_0013f11b:
    iVar12 = 0;
    prvTidyReport(doc,rowgroup,node,0x235);
    prvTidyFreeNode(doc,node);
  } while( true );
}

Assistant:

Node* TY_(ParseRowGroup)( TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_TEXTNODE,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( rowgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        rowgroup = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(rowgroup);
        if (rowgroup->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, IgnoreWhitespace);
        
        switch (state)
        {
            case STATE_INITIAL:
            {
                TidyParserMemory memory = {0};

                if (node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == rowgroup->tag)
                {
                    if (node->type == EndTag)
                    {
                        rowgroup->closed = yes;
                        TY_(FreeNode)( doc, node);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* if </table> infer end tag */
                if ( nodeIsTABLE(node) && node->type == EndTag )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(rowgroup, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if TD or TH then infer <TR>
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TR);
                        TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        MoveBeforeTable( doc, rowgroup, node );
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;

                        if (node->type != TextNode)
                        {
                            memory.identity = TY_(ParseRowGroup);
                            memory.original_node = rowgroup;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_TEXTNODE;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        state = STATE_POST_NOT_TEXTNODE;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead(doc, rowgroup, node);
                        continue;
                    }
                }

                /*
                  if this is the end tag for ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    for ( parent = rowgroup->parent;
                          parent != NULL;
                          parent = parent->parent )
                    {
                        if (node->tag == parent->tag)
                        {
                            TY_(UngetToken)( doc );
                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                }

                /*
                  if THEAD, TFOOT or TBODY then implied end tag

                */
                if (node->tag->model & CM_ROWGRP)
                {
                    if (node->type != EndTag)
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                if ( !nodeIsTR(node) )
                {
                    node = TY_(InferredTag)(doc, TidyTag_TR);
                    TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    TY_(UngetToken)( doc );
                }

               /* node should be <TR> */
                TY_(InsertNodeAtEnd)(rowgroup, node);
                memory.identity = TY_(ParseRowGroup);
                memory.original_node = rowgroup;
                memory.reentry_node = node;
                memory.reentry_state = STATE_INITIAL;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;
                
                
            case STATE_POST_NOT_TEXTNODE:
            {
                lexer->exiled = no;
                state = STATE_INITIAL;
                continue;
            } break;

                
            default:
                break;
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}